

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int __thiscall ImGuiStorage::GetInt(ImGuiStorage *this,ImGuiID key,int default_val)

{
  ImGuiStoragePair *pIVar1;
  ImGuiStoragePair *pIVar2;
  ImGuiStoragePair *it;
  int default_val_local;
  ImGuiID key_local;
  ImGuiStorage *this_local;
  
  pIVar1 = LowerBound(&this->Data,key);
  pIVar2 = ImVector<ImGuiStorage::ImGuiStoragePair>::end
                     ((ImVector<ImGuiStorage::ImGuiStoragePair> *)this);
  this_local._4_4_ = default_val;
  if ((pIVar1 != pIVar2) && (pIVar1->key == key)) {
    this_local._4_4_ = (pIVar1->field_1).val_i;
  }
  return this_local._4_4_;
}

Assistant:

int ImGuiStorage::GetInt(ImGuiID key, int default_val) const
{
    ImGuiStoragePair* it = LowerBound(const_cast<ImVector<ImGuiStoragePair>&>(Data), key);
    if (it == Data.end() || it->key != key)
        return default_val;
    return it->val_i;
}